

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O3

BUFFER_HANDLE
mqtt_codec_subscribe
          (uint16_t packetId,SUBSCRIBE_PAYLOAD *subscribeList,size_t count,STRING_HANDLE trace_log)

{
  char *__src;
  int iVar1;
  BUFFER_HANDLE ctrlPacket;
  STRING_HANDLE handle;
  size_t sVar2;
  size_t __n;
  uchar *puVar3;
  
  if ((count == 0 || subscribeList == (SUBSCRIBE_PAYLOAD *)0x0) ||
     (ctrlPacket = BUFFER_new(), ctrlPacket == (BUFFER_HANDLE)0x0)) {
    return (BUFFER_HANDLE)0x0;
  }
  iVar1 = constructSubscibeTypeVariableHeader(ctrlPacket,packetId);
  if (iVar1 != 0) {
    BUFFER_delete(ctrlPacket);
    return (BUFFER_HANDLE)0x0;
  }
  if (trace_log == (STRING_HANDLE)0x0) {
    handle = (STRING_HANDLE)0x0;
  }
  else {
    handle = STRING_construct_sprintf(" | PACKET_ID: %u",(ulong)packetId);
  }
  do {
    sVar2 = BUFFER_length(ctrlPacket);
    __n = strlen(subscribeList->subscribeTopic);
    if ((0xffff < __n) || (iVar1 = BUFFER_enlarge(ctrlPacket,__n + 3), iVar1 != 0))
    goto LAB_00163bae;
    puVar3 = BUFFER_u_char(ctrlPacket);
    __src = subscribeList->subscribeTopic;
    *(ushort *)(puVar3 + sVar2) = (ushort)__n << 8 | (ushort)__n >> 8;
    memcpy(puVar3 + sVar2 + 2,__src,__n);
    puVar3[__n + 2 + sVar2] = (char)subscribeList->qosReturn;
    if (handle != (STRING_HANDLE)0x0) {
      STRING_sprintf(handle," | TOPIC_NAME: %s | QOS: %d",subscribeList->subscribeTopic,
                     (ulong)(uint)subscribeList->qosReturn);
    }
    subscribeList = subscribeList + 1;
    count = count - 1;
  } while (count != 0);
  if (trace_log == (STRING_HANDLE)0x0) {
    iVar1 = constructFixedHeader(ctrlPacket,SUBSCRIBE_TYPE,'\x02');
    if (iVar1 == 0) goto LAB_00163bb8;
  }
  else {
    STRING_concat(trace_log,"SUBSCRIBE");
    iVar1 = constructFixedHeader(ctrlPacket,SUBSCRIBE_TYPE,'\x02');
    if (iVar1 == 0) {
      STRING_concat_with_STRING(trace_log,handle);
      goto LAB_00163bb8;
    }
  }
LAB_00163bae:
  BUFFER_delete(ctrlPacket);
  ctrlPacket = (BUFFER_HANDLE)0x0;
LAB_00163bb8:
  if (handle != (STRING_HANDLE)0x0) {
    STRING_delete(handle);
    return ctrlPacket;
  }
  return ctrlPacket;
}

Assistant:

BUFFER_HANDLE mqtt_codec_subscribe(uint16_t packetId, SUBSCRIBE_PAYLOAD* subscribeList, size_t count, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_023: [If the parameters subscribeList is NULL or if count is 0 then mqtt_codec_subscribe shall return NULL.] */
    if (subscribeList == NULL || count == 0)
    {
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_026: [mqtt_codec_subscribe shall return a BUFFER_HANDLE that represents a MQTT SUBSCRIBE message.]*/
        result = BUFFER_new();
        if (result != NULL)
        {
            if (constructSubscibeTypeVariableHeader(result, packetId) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                STRING_HANDLE sub_trace = NULL;
                if (trace_log != NULL)
                {
                    sub_trace = STRING_construct_sprintf(" | PACKET_ID: %"PRIu16, packetId);
                }
                /* Codes_SRS_MQTT_CODEC_07_024: [mqtt_codec_subscribe shall iterate through count items in the subscribeList.] */
                if (addListItemsToSubscribePacket(result, subscribeList, count, sub_trace) != 0)
                {
                    /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                    BUFFER_delete(result);
                    result = NULL;
                }
                else
                {

                    if (trace_log != NULL)
                    {
                        STRING_concat(trace_log, "SUBSCRIBE");
                    }
                    if (constructFixedHeader(result, SUBSCRIBE_TYPE, SUBSCRIBE_FIXED_HEADER_FLAG) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, sub_trace);
                        }
                    }
                }
                if (sub_trace != NULL)
                {
                    STRING_delete(sub_trace);
                }
            }
        }
    }
    return result;
}